

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

void __thiscall
Peers::peerIsConnected(Peers *this,unique_ptr<Peer,_std::default_delete<Peer>_> *peer)

{
  uint16_t uVar1;
  pointer pPVar2;
  mapped_type *this_00;
  Events *this_01;
  unique_ptr<Event,_std::default_delete<Event>_> *this_02;
  pointer this_03;
  mapped_type *this_04;
  string local_e8;
  string local_c8;
  int *local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  const_iterator local_78;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  uint local_60 [4];
  string local_50;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> ipPeers;
  unique_ptr<Peer,_std::default_delete<Peer>_> *peer_local;
  Peers *this_local;
  
  ipPeers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)peer;
  pPVar2 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator->(peer);
  Peer::ip_abi_cxx11_(&local_50,pPVar2);
  ip2Peers((vector<int,_std::allocator<int>_> *)local_30,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pPVar2 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator->(peer);
  uVar1 = Peer::port(pPVar2);
  local_60[0] = (uint)uVar1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_30,(value_type_conflict2 *)local_60);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_30);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_68,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_70);
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_30);
  local_80 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_90);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_78,
             &local_80);
  local_a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_30);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
             &local_a0);
  local_a8 = (int *)std::vector<int,_std::allocator<int>_>::erase
                              ((vector<int,_std::allocator<int>_> *)local_30,local_78,local_98);
  pPVar2 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator->(peer);
  Peer::ip_abi_cxx11_(&local_c8,pPVar2);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,&local_c8);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)local_30);
  std::__cxx11::string::~string((string *)&local_c8);
  this_01 = P2PSocket::events(this->m_p2pSocket);
  this_02 = Events::onPeerConnect(this_01);
  this_03 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(this_02);
  pPVar2 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::get(peer);
  Event::trigger<Peer*>(this_03,pPVar2);
  pPVar2 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator->(peer);
  Peer::name_abi_cxx11_(&local_e8,pPVar2);
  this_04 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
            ::operator[](&this->m_peers,&local_e8);
  std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator=(this_04,peer);
  std::__cxx11::string::~string((string *)&local_e8);
  this->m_count = this->m_count + 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void Peers::peerIsConnected(std::unique_ptr<Peer> peer)
{
    // Map multiple ports from same IP
    auto ipPeers = ip2Peers(peer->ip());
    ipPeers.push_back((peer->port()));

    std::sort(ipPeers.begin(), ipPeers.end());
    ipPeers.erase(unique(ipPeers.begin(), ipPeers.end()), ipPeers.end());
    m_ip2PeerMap[peer->ip()] = ipPeers;
    m_p2pSocket->events()->onPeerConnect()->trigger(peer.get());

    m_peers[peer->name()] = std::move(peer);
    ++m_count;
}